

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O0

Vec_Flt_t * Abc_SclFindWireCaps(SC_WireLoad *pWL,int nFanoutMax)

{
  float fVar1;
  int iVar2;
  Vec_Flt_t *p;
  float fVar3;
  int local_48;
  int EntryMax;
  int Entry;
  int k;
  int iPrev;
  int i;
  float Slope;
  float EntryCur;
  float EntryPrev;
  Vec_Flt_t *vCaps;
  int nFanoutMax_local;
  SC_WireLoad *pWL_local;
  
  if (pWL == (SC_WireLoad *)0x0) {
    __assert_fail("pWL != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLoad.c"
                  ,0x32,"Vec_Flt_t *Abc_SclFindWireCaps(SC_WireLoad *, int)");
  }
  local_48 = 0;
  for (k = 0; iVar2 = Vec_IntSize(&pWL->vFanout), k < iVar2; k = k + 1) {
    iVar2 = Vec_IntEntry(&pWL->vFanout,k);
    local_48 = Abc_MaxInt(local_48,iVar2);
  }
  iVar2 = Abc_MaxInt(nFanoutMax,local_48);
  p = Vec_FltStart(iVar2 + 1);
  for (k = 0; iVar2 = Vec_IntSize(&pWL->vFanout), k < iVar2; k = k + 1) {
    iVar2 = Vec_IntEntry(&pWL->vFanout,k);
    fVar3 = Vec_FltEntry(&pWL->vLen,k);
    Vec_FltWriteEntry(p,iVar2,fVar3 * pWL->cap);
  }
  fVar3 = Vec_FltEntry(p,1);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = Vec_FltEntry(p,1);
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      __assert_fail("Vec_FltEntry(vCaps, 1) != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLoad.c"
                    ,0x3e,"Vec_Flt_t *Abc_SclFindWireCaps(SC_WireLoad *, int)");
    }
    Entry = 1;
    Slope = Vec_FltEntry(p,1);
    for (k = 2; iVar2 = Vec_FltSize(p), EntryMax = Entry, k < iVar2; k = k + 1) {
      fVar3 = Vec_FltEntry(p,k);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        while (EntryMax = EntryMax + 1, EntryMax < k) {
          Vec_FltWriteEntry(p,EntryMax,
                            ((fVar3 - Slope) / (float)(k - Entry)) * (float)(EntryMax - Entry) +
                            Slope);
        }
        Entry = k;
        Slope = fVar3;
      }
    }
    fVar3 = pWL->cap;
    fVar1 = pWL->slope;
    while (EntryMax = EntryMax + 1, EntryMax < k) {
      Vec_FltWriteEntry(p,EntryMax,fVar3 * fVar1 * (float)(EntryMax - Entry) + Slope);
    }
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns estimated wire capacitances for each fanout count.]

  Description []
               
  SideEffects []`

  SeeAlso     []

***********************************************************************/
Vec_Flt_t * Abc_SclFindWireCaps( SC_WireLoad * pWL, int nFanoutMax )
{
    Vec_Flt_t * vCaps = NULL;
    float EntryPrev, EntryCur, Slope;
    int i, iPrev, k, Entry, EntryMax;
    assert( pWL != NULL );
    // find the biggest fanout count
    EntryMax = 0;
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        EntryMax = Abc_MaxInt( EntryMax, Entry );
    // create the array
    vCaps = Vec_FltStart( Abc_MaxInt(nFanoutMax, EntryMax) + 1 );
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        Vec_FltWriteEntry( vCaps, Entry, Vec_FltEntry(&pWL->vLen, i) * pWL->cap );
    if ( Vec_FltEntry(vCaps, 1) == 0 )
        return vCaps;
    // interpolate between the values
    assert( Vec_FltEntry(vCaps, 1) != 0 );
    iPrev = 1;
    EntryPrev = Vec_FltEntry(vCaps, 1);
    Vec_FltForEachEntryStart( vCaps, EntryCur, i, 2 )
    {
        if ( EntryCur == 0 )
            continue;
        Slope = (EntryCur - EntryPrev) / (i - iPrev);
        for ( k = iPrev + 1; k < i; k++ )
            Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
        EntryPrev = EntryCur;
        iPrev = i;
    }
    // extrapolate after the largest value
    Slope = pWL->cap * pWL->slope;
    for ( k = iPrev + 1; k < i; k++ )
        Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
    // show
//    Vec_FltForEachEntry( vCaps, EntryCur, i )
//        printf( "%3d : %f\n", i, EntryCur );
    return vCaps;
}